

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioSerialRead(uint gpio,void *buf,size_t bufSize)

{
  int *piVar1;
  FILE *__stream;
  uint uVar2;
  ulong uVar3;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: gpio=%d buf=%08X bufSize=%d\n",myTimeStamp::buf,"gpioSerialRead",
            (ulong)gpio,(ulong)buf & 0xffffffff,bufSize);
  }
  if (libInitialised == '\0') {
    uVar2 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSerialRead_cold_1();
    }
  }
  else if (gpio < 0x20) {
    if (bufSize == 0) {
      uVar2 = 0xffffffcd;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        gpioSerialRead_cold_3();
      }
    }
    else if (wfRx[gpio].mode == 1) {
      uVar2 = 0;
      if (wfRx[gpio].field_4.s.readPos != wfRx[gpio].field_4.s.writePos) {
        uVar2 = wfRx[gpio].field_4.s.writePos;
        if (uVar2 <= (uint)wfRx[gpio].field_4.s.readPos) {
          uVar2 = wfRx[gpio].field_4.s.bufSize;
        }
        uVar2 = uVar2 - wfRx[gpio].field_4.s.readPos;
        uVar3 = bufSize & 0xffffffff;
        if (uVar2 <= bufSize) {
          uVar3 = (ulong)uVar2;
        }
        uVar2 = (int)(uVar3 / (uint)wfRx[gpio].field_4.s.bytes) * wfRx[gpio].field_4.s.bytes;
        if (buf != (void *)0x0) {
          memcpy(buf,wfRx[gpio].field_4.s.buf + wfRx[gpio].field_4.s.readPos,(ulong)uVar2);
        }
        piVar1 = &wfRx[gpio].field_4.s.readPos;
        *piVar1 = *piVar1 + uVar2;
        if (wfRx[gpio].field_4.s.bufSize <= (uint)wfRx[gpio].field_4.s.readPos) {
          wfRx[gpio].field_4.s.readPos = 0;
        }
      }
    }
    else {
      uVar2 = 0xffffffda;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        gpioSerialRead_cold_2();
      }
    }
  }
  else {
    uVar2 = 0xfffffffe;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSerialRead_cold_4();
    }
  }
  return uVar2;
}

Assistant:

int gpioSerialRead(unsigned gpio, void *buf, size_t bufSize)
{
   unsigned bytes=0, wpos;
   volatile wfRx_t *w;

   DBG(DBG_USER, "gpio=%d buf=%08X bufSize=%d", gpio, (int)buf, bufSize);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   if (bufSize == 0)
      SOFT_ERROR(PI_BAD_SERIAL_COUNT, "buffer size can't be zero");

   if (wfRx[gpio].mode != PI_WFRX_SERIAL)
      SOFT_ERROR(PI_NOT_SERIAL_GPIO, "no serial read on gpio (%d)", gpio);

   w = &wfRx[gpio];

   if (w->s.readPos != w->s.writePos)
   {
      wpos = w->s.writePos;

      if (wpos > w->s.readPos) bytes = wpos - w->s.readPos;
      else                     bytes = w->s.bufSize - w->s.readPos;

      if (bytes > bufSize) bytes = bufSize;

      /* copy in multiples of the data size in bytes */

      bytes = (bytes / w->s.bytes) * w->s.bytes;

      if (buf) memcpy(buf, w->s.buf+w->s.readPos, bytes);

      w->s.readPos += bytes;

      if (w->s.readPos >= w->s.bufSize) w->s.readPos = 0;
   }
   return bytes;
}